

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void CEditor::CallbackSaveMap(char *pFileName,int StorageType,void *pUser)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CEditor *pEditor;
  char aBuf [1024];
  char *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  bool bVar4;
  char local_408 [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = str_endswith(in_RDX,(char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0)
                       );
  if (pcVar3 == (char *)0x0) {
    str_format(local_408,0x400,"%s.map",in_RDI);
  }
  iVar2 = Save((CEditor *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
  if (iVar2 != 0) {
    str_copy((char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
             in_stack_fffffffffffffbc8,0);
    bVar4 = false;
    if (in_ESI == 0) {
      bVar4 = *(char **)(in_RDX + 0xed0) == in_RDX + 0xad0;
    }
    in_RDX[0x89c] = bVar4;
    in_RDX[0x1248] = '\0';
  }
  in_RDX[0x47c] = '\0';
  in_RDX[0x47d] = '\0';
  in_RDX[0x47e] = '\0';
  in_RDX[0x47f] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::CallbackSaveMap(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = static_cast<CEditor*>(pUser);
	char aBuf[1024];
	// add map extension
	if(!str_endswith(pFileName, ".map"))
	{
		str_format(aBuf, sizeof(aBuf), "%s.map", pFileName);
		pFileName = aBuf;
	}

	if(pEditor->Save(pFileName))
	{
		str_copy(pEditor->m_aFileName, pFileName, sizeof(pEditor->m_aFileName));
		pEditor->m_ValidSaveFilename = StorageType == IStorage::TYPE_SAVE && pEditor->m_pFileDialogPath == pEditor->m_aFileDialogCurrentFolder;
		pEditor->m_Map.m_Modified = false;
	}

	pEditor->m_Dialog = DIALOG_NONE;
}